

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

CompiledModule * __thiscall
capnp::compiler::Compiler::Impl::addInternal(Impl *this,Module *parsedModule)

{
  Disposer *pDVar1;
  CompiledModule *pCVar2;
  mapped_type *pmVar3;
  Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t> OVar4;
  Disposer *local_30;
  CompiledModule *local_28;
  
  local_30 = (Disposer *)parsedModule;
  pmVar3 = std::__detail::
           _Map_base<capnp::compiler::Module_*,_std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>,_std::allocator<std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Module_*>,_std::hash<capnp::compiler::Module_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<capnp::compiler::Module_*,_std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>,_std::allocator<std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Module_*>,_std::hash<capnp::compiler::Module_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->modules,(key_type *)&local_30);
  if (pmVar3->ptr == (CompiledModule *)0x0) {
    OVar4 = kj::
            heap<capnp::compiler::Compiler::CompiledModule,capnp::compiler::Compiler::Impl&,capnp::compiler::Module&>
                      ((kj *)&local_30,this,parsedModule);
    pDVar1 = pmVar3->disposer;
    pCVar2 = pmVar3->ptr;
    pmVar3->disposer = local_30;
    pmVar3->ptr = local_28;
    local_28 = (CompiledModule *)0x0;
    if (pCVar2 != (CompiledModule *)0x0) {
      (**pDVar1->_vptr_Disposer)(pDVar1,pCVar2,OVar4.ptr);
    }
    if (local_28 != (CompiledModule *)0x0) {
      local_28 = (CompiledModule *)0x0;
      (**local_30->_vptr_Disposer)();
    }
  }
  return pmVar3->ptr;
}

Assistant:

Compiler::CompiledModule& Compiler::Impl::addInternal(Module& parsedModule) {
  kj::Own<CompiledModule>& slot = modules[&parsedModule];
  if (slot.get() == nullptr) {
    slot = kj::heap<CompiledModule>(*this, parsedModule);
  }

  return *slot;
}